

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O0

params_t * __thiscall
iutest::detail::iuCsvFileParamsGenerator<int>::ReadParams
          (params_t *__return_storage_ptr__,iuCsvFileParamsGenerator<int> *this,string *path,
          char delimiter)

{
  bool bVar1;
  IFile *this_00;
  char *filename;
  iu_stringstream *piVar2;
  ostream *poVar3;
  IUTestLog local_3d0;
  IUTestLog local_240;
  string local_b0;
  undefined1 local_90 [8];
  string data;
  size_type pos;
  size_type prev;
  string dataset;
  IFile *fp;
  char delimiter_local;
  string *path_local;
  iuCsvFileParamsGenerator<int> *this_local;
  params_t *params;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  this_00 = IFileSystem::New();
  if (this_00 != (IFile *)0x0) {
    filename = (char *)std::__cxx11::string::c_str();
    bVar1 = IFile::Open(this_00,filename,1);
    if (bVar1) {
      (*(this_00->super_IInStream)._vptr_IInStream[4])(&prev,&this_00->super_IInStream);
      data.field_2._8_8_ = 0;
      while (data.field_2._8_8_ =
                  std::__cxx11::string::find((char)&prev,(ulong)(uint)(int)delimiter),
            data.field_2._8_8_ != -1) {
        std::__cxx11::string::substr((ulong)local_90,(ulong)&prev);
        AppendParams(this,__return_storage_ptr__,(string *)local_90);
        data.field_2._8_8_ = data.field_2._8_8_ + 1;
        std::__cxx11::string::~string((string *)local_90);
      }
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&prev);
      AppendParams(this,__return_storage_ptr__,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(__return_storage_ptr__);
      if (bVar1) {
        IUTestLog::IUTestLog
                  (&local_240,LOG_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/../include/internal/iutest_genparams_from_file.hpp"
                   ,0x4d);
        piVar2 = IUTestLog::GetStream_abi_cxx11_(&local_240);
        poVar3 = std::operator<<((ostream *)&piVar2->field_0x10,"Empty params file \"");
        poVar3 = std::operator<<(poVar3,(string *)path);
        std::operator<<(poVar3,"\".");
        IUTestLog::~IUTestLog(&local_240);
      }
      std::__cxx11::string::~string((string *)&prev);
      goto LAB_002f1bef;
    }
  }
  IUTestLog::IUTestLog
            (&local_3d0,LOG_WARNING,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/../include/internal/iutest_genparams_from_file.hpp"
             ,0x52);
  piVar2 = IUTestLog::GetStream_abi_cxx11_(&local_3d0);
  poVar3 = std::operator<<((ostream *)&piVar2->field_0x10,"Unable to open file \"");
  poVar3 = std::operator<<(poVar3,(string *)path);
  std::operator<<(poVar3,"\".");
  IUTestLog::~IUTestLog(&local_3d0);
LAB_002f1bef:
  IFileSystem::Free(this_00);
  return __return_storage_ptr__;
}

Assistant:

params_t ReadParams(const ::std::string& path, char delimiter = ',')
    {
        params_t params;
        IFile* fp = detail::IFileSystem::New();
        if( (fp != NULL) && fp->Open(path.c_str(), IFile::OpenRead) )
        {
            const ::std::string dataset = fp->ReadAll();
            ::std::string::size_type prev = 0;
            ::std::string::size_type pos = 0;
            while( static_cast<void>(pos = dataset.find(delimiter, prev)), pos != ::std::string::npos )
            {
                const ::std::string data = dataset.substr(prev, pos - prev);
                AppendParams(params, data);
                ++pos;
                prev = pos;
            }
            AppendParams(params, dataset.substr(prev));

            if( params.empty() )
            {
                IUTEST_LOG_(WARNING) << "Empty params file \"" << path << "\".";
            }
        }
        else
        {
            IUTEST_LOG_(WARNING) << "Unable to open file \"" << path << "\".";
        }
        detail::IFileSystem::Free(fp);
        return params;
    }